

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void duckdb_je_arena_reset(tsd_t *tsd,arena_t *arena)

{
  rtree_ctx_cache_elm_t *prVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  ulong *puVar4;
  bin_t *bin;
  void *pvVar5;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  int iVar8;
  edata_t *peVar9;
  ulong uVar10;
  rtree_ctx_t *rtree_ctx;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  rtree_ctx_cache_elm_t *prVar14;
  rtree_ctx_cache_elm_t *prVar15;
  mutex_prof_data_t *data_2;
  pthread_mutex_t *ppVar16;
  bool bVar17;
  mutex_prof_data_t *data;
  rtree_ctx_t local_1b0;
  
  ppVar16 = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x48);
  iVar8 = pthread_mutex_trylock(ppVar16);
  if (iVar8 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&arena->large_mtx);
    (arena->large_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if (&((arena->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    (arena->large_mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar3 = &(arena->large_mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  peVar9 = (arena->large).head.qlh_first;
  if (peVar9 != (edata_t *)0x0) {
    do {
      pvVar5 = peVar9->e_addr;
      (arena->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(ppVar16);
      rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      if (tsd == (tsd_t *)0x0) {
        duckdb_je_rtree_ctx_data_init(&local_1b0);
        rtree_ctx = &local_1b0;
      }
      uVar10 = (ulong)pvVar5 & 0xffffffffc0000000;
      uVar11 = (ulong)(((uint)((ulong)pvVar5 >> 0x1e) & 0xf) << 4);
      puVar4 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar11);
      uVar11 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar11);
      if (uVar11 != uVar10) {
        if (rtree_ctx->l2_cache[0].leafkey == uVar10) {
          prVar6 = rtree_ctx->l2_cache[0].leaf;
          rtree_ctx->l2_cache[0].leafkey = uVar11;
          rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
          *puVar4 = uVar10;
          puVar4[1] = (ulong)prVar6;
        }
        else {
          prVar14 = rtree_ctx->l2_cache + 1;
          if (rtree_ctx->l2_cache[1].leafkey == uVar10) {
            uVar13 = 0;
            bVar17 = false;
          }
          else {
            uVar7 = 1;
            prVar15 = prVar14;
            do {
              uVar13 = uVar7;
              bVar17 = 6 < uVar13;
              if (uVar13 == 7) goto LAB_01c68cd5;
              prVar14 = prVar15 + 1;
              prVar1 = prVar15 + 1;
              uVar7 = uVar13 + 1;
              prVar15 = prVar14;
            } while (prVar1->leafkey != uVar10);
            bVar17 = 6 < uVar13;
          }
          prVar6 = prVar14->leaf;
          prVar14->leafkey = rtree_ctx->l2_cache[uVar13].leafkey;
          prVar14->leaf = rtree_ctx->l2_cache[uVar13].leaf;
          rtree_ctx->l2_cache[uVar13].leafkey = uVar11;
          rtree_ctx->l2_cache[uVar13].leaf = (rtree_leaf_elm_t *)puVar4[1];
          *puVar4 = uVar10;
          puVar4[1] = (ulong)prVar6;
LAB_01c68cd5:
          if (bVar17) {
            duckdb_je_rtree_leaf_elm_lookup_hard
                      ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                       (ulong)pvVar5 & 0xfffffffffffff000,true,false);
          }
        }
      }
      duckdb_je_large_dalloc((tsdn_t *)tsd,peVar9);
      iVar8 = pthread_mutex_trylock(ppVar16);
      if (iVar8 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&arena->large_mtx);
        (arena->large_mtx).field_0.field_0.locked.repr = true;
      }
      puVar2 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar2 = *puVar2 + 1;
      if (&((arena->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
        (arena->large_mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
        ppwVar3 = &(arena->large_mtx).field_0.witness.link.qre_prev;
        *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
      }
      peVar9 = (arena->large).head.qlh_first;
    } while (peVar9 != (edata_t *)0x0);
  }
  (arena->large_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar16);
  uVar11 = 0;
  do {
    if (duckdb_je_bin_infos[uVar11].n_shards != 0) {
      uVar10 = 0;
      do {
        lVar12 = uVar10 << 8;
        if (uVar11 < duckdb_je_bin_info_nbatched_sizes) {
          lVar12 = uVar10 * 0x288;
        }
        bin = (bin_t *)((long)&arena->nthreads[0].repr +
                       lVar12 + (ulong)duckdb_je_arena_bin_offsets[uVar11]);
        ppVar16 = (pthread_mutex_t *)
                  ((long)&((atomic_zu_t *)(arena->nthreads + 0x12))->repr +
                  lVar12 + (ulong)duckdb_je_arena_bin_offsets[uVar11]);
        iVar8 = pthread_mutex_trylock(ppVar16);
        if (iVar8 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
          (bin->lock).field_0.field_0.locked.repr = true;
        }
        puVar2 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
        *puVar2 = *puVar2 + 1;
        if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
          (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
          ppwVar3 = &(bin->lock).field_0.witness.link.qre_prev;
          *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
        }
        if (uVar11 < duckdb_je_bin_info_nbatched_sizes) {
          batcher_init((batcher_t *)(bin + 1),0x10);
        }
        peVar9 = bin->slabcur;
        if (peVar9 != (edata_t *)0x0) {
          bin->slabcur = (edata_t *)0x0;
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar16);
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,arena,peVar9);
          iVar8 = pthread_mutex_trylock(ppVar16);
          if (iVar8 != 0) {
            duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar2 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar2 = *puVar2 + 1;
          if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar3 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
          }
        }
        peVar9 = duckdb_je_edata_heap_remove_first(&bin->slabs_nonfull);
        while (peVar9 != (edata_t *)0x0) {
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar16);
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,arena,peVar9);
          iVar8 = pthread_mutex_trylock(ppVar16);
          if (iVar8 != 0) {
            duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar2 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar2 = *puVar2 + 1;
          if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar3 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
          }
          peVar9 = duckdb_je_edata_heap_remove_first(&bin->slabs_nonfull);
        }
        peVar9 = (bin->slabs_full).head.qlh_first;
        while (peVar9 != (edata_t *)0x0) {
          arena_bin_slabs_full_remove(arena,bin,peVar9);
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar16);
          duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,arena,peVar9);
          iVar8 = pthread_mutex_trylock(ppVar16);
          if (iVar8 != 0) {
            duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar2 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar2 = *puVar2 + 1;
          if (&((bin->lock).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            (bin->lock).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar3 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
          }
          peVar9 = (bin->slabs_full).head.qlh_first;
        }
        (bin->stats).curregs = 0;
        (bin->stats).curslabs = 0;
        (bin->lock).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(ppVar16);
        uVar10 = uVar10 + 1;
      } while (uVar10 < duckdb_je_bin_infos[uVar11].n_shards);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x24);
  duckdb_je_pa_shard_reset((tsdn_t *)tsd,&arena->pa_shard);
  return;
}

Assistant:

void
arena_reset(tsd_t *tsd, arena_t *arena) {
	/*
	 * Locking in this function is unintuitive.  The caller guarantees that
	 * no concurrent operations are happening in this arena, but there are
	 * still reasons that some locking is necessary:
	 *
	 * - Some of the functions in the transitive closure of calls assume
	 *   appropriate locks are held, and in some cases these locks are
	 *   temporarily dropped to avoid lock order reversal or deadlock due to
	 *   reentry.
	 * - mallctl("epoch", ...) may concurrently refresh stats.  While
	 *   strictly speaking this is a "concurrent operation", disallowing
	 *   stats refreshes would impose an inconvenient burden.
	 */

	/* Large allocations. */
	malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);

	for (edata_t *edata = edata_list_active_first(&arena->large);
	    edata != NULL; edata = edata_list_active_first(&arena->large)) {
		void *ptr = edata_base_get(edata);
		size_t usize;

		malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);
		emap_alloc_ctx_t alloc_ctx;
		emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
		    &alloc_ctx);
		assert(alloc_ctx.szind != SC_NSIZES);

		if (config_stats || (config_prof && opt_prof)) {
			usize = sz_index2size(alloc_ctx.szind);
			assert(usize == isalloc(tsd_tsdn(tsd), ptr));
		}
		/* Remove large allocation from prof sample set. */
		if (config_prof && opt_prof) {
			prof_free(tsd, ptr, usize, &alloc_ctx);
		}
		if (config_prof && opt_prof && alloc_ctx.szind < SC_NBINS) {
			arena_dalloc_promoted_impl(tsd_tsdn(tsd), ptr,
			    /* tcache */ NULL, /* slow_path */ true, edata);
		} else {
			large_dalloc(tsd_tsdn(tsd), edata);
		}
		malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);

	/* Bins. */
	for (unsigned i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			arena_bin_reset(tsd, arena, arena_get_bin(arena, i, j),
			    i);
		}
	}
	pa_shard_reset(tsd_tsdn(tsd), &arena->pa_shard);
}